

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O2

void __thiscall
boost::python::
class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
def_maybe_overloads<void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int)>
          (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
           *this,char *name,first_type fn,first_type *a1,...)

{
  undefined8 in_R8;
  first_type local_60;
  first_type *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  undefined1 local_8 [8];
  
  local_48 = local_8;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  local_60 = fn;
  local_58 = a1;
  local_50 = in_R8;
  local_40 = local_48;
  local_38 = local_48;
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (this,(AbstractModuleClient *)0x0,name,fn,
             (def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)a1,&local_50,&local_60);
  return;
}

Assistant:

void def_maybe_overloads(
        char const* name
        , Fn fn
        , A1 const& a1
        , ...)
    {
        this->def_impl(
            detail::unwrap_wrapper((W*)0)
          , name
          , fn
          , detail::def_helper<A1>(a1)
          , &fn
        );

    }